

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void juzzlin::SimpleLogger::initialize(string *filename,bool append)

{
  byte in_SIL;
  string *in_RDI;
  bool in_stack_0000001f;
  string *in_stack_00000020;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::__cxx11::string::string(local_30,in_RDI);
  Impl::initialize(in_stack_00000020,in_stack_0000001f);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SimpleLogger::initialize(std::string filename, bool append)
{
    Impl::initialize(filename, append);
}